

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadBodyTorque::ChLoadBodyTorque
          (ChLoadBodyTorque *this,shared_ptr<chrono::ChBody> *body,ChVector<double> *torque,
          bool param_3)

{
  __shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  __shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  undefined8 local_28;
  
  std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_38,&body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  ChLoadCustom::ChLoadCustom(&this->super_ChLoadCustom,(shared_ptr<chrono::ChLoadable> *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  (this->super_ChLoadCustom).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadBodyTorque_0116cc30;
  (this->m_torque).m_data[0] = torque->m_data[0];
  (this->m_torque).m_data[1] = torque->m_data[1];
  (this->m_torque).m_data[2] = torque->m_data[2];
  this->m_local_torque = param_3;
  (this->m_modulation).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)(ZEXT816(0) << 0x20);
  this->m_scale = 1.0;
  local_28 = 0x3ff0000000000000;
  std::make_shared<chrono::ChFunction_Const,double>((double *)&_Stack_48);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->m_modulation,
             &_Stack_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  return;
}

Assistant:

ChLoadBodyTorque::ChLoadBodyTorque(std::shared_ptr<ChBody> body, const ChVector<>& torque, bool local_torque)
    : ChLoadCustom(body), m_torque(torque), m_local_torque(local_torque), m_scale(1) {
    m_modulation = chrono_types::make_shared<ChFunction_Const>(1.0);
}